

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void nv2_if(Context *ctx)

{
  uint uVar1;
  uint uVar2;
  char failbranch [32];
  char acStack_38 [40];
  
  if ((ctx->profile_supports_nv4 == 0) && (ctx->shader_type != MOJOSHADER_TYPE_PIXEL)) {
    uVar1 = ctx->assigned_branch_labels;
    ctx->assigned_branch_labels = uVar1 + 1;
    snprintf(acStack_38,0x20,"branch_label%d",(ulong)uVar1);
    uVar2 = ctx->branch_labels_stack_index;
    if ((ulong)uVar2 < 0x20) {
      ctx->branch_labels_stack_index = uVar2 + 1;
      ctx->branch_labels_stack[uVar2] = uVar1;
      output_line(ctx,"BRA %s (EQ.x);",acStack_38);
      return;
    }
    __assert_fail("((size_t) ctx->branch_labels_stack_index) < STATICARRAYLEN(ctx->branch_labels_stack)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x1ea7,"void nv2_if(Context *)");
  }
  output_line(ctx,"IF EQ.x;");
  return;
}

Assistant:

static void nv2_if(Context *ctx)
{
    // The condition code register MUST be set up before this!
    // nv2 fragment programs (and everything nv4) have a real IF.
    if ( (support_nv4(ctx)) || (shader_is_pixel(ctx)) )
        output_line(ctx, "IF EQ.x;");
    else
    {
        // there's no IF construct, but we can use a branch to a label.
        char failbranch[32];
        const int label = allocate_branch_label(ctx);
        get_ARB1_branch_label_name(ctx, label, failbranch, sizeof (failbranch));

        assert(((size_t) ctx->branch_labels_stack_index)
                 < STATICARRAYLEN(ctx->branch_labels_stack));

        ctx->branch_labels_stack[ctx->branch_labels_stack_index++] = label;

        // !!! FIXME: should this be NE? (EQ would jump to the ELSE for the IF condition, right?).
        output_line(ctx, "BRA %s (EQ.x);", failbranch);
    } // else
}